

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O1

void __thiscall wasm::FunctionValidator::visitRefAs(FunctionValidator *this,RefAs *curr)

{
  Expression *curr_00;
  char *text;
  Type left;
  Type local_38;
  Type local_30;
  
  if (curr->op == ExternExternalize) {
    ValidationInfo::shouldBeTrue<wasm::RefAs*>
              (this->info,
               (bool)((byte)((((this->
                               super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                               ).
                               super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                               .
                               super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                              .currModule)->features).features >> 10) & 1),curr,
               "extern.externalize requries GC [--enable-gc]",
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
               ).
               super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .currFunction);
    if ((curr->super_SpecificExpression<(wasm::Expression::Id)72>).super_Expression.type.id == 1) {
      return;
    }
    left.id = (curr->value->type).id;
    wasm::Type::Type(&local_30,(HeapType)0x2,Nullable);
    curr_00 = curr->value;
    text = "extern.externalize value should be an anyref";
    local_38.id = local_30.id;
  }
  else {
    if (curr->op != ExternInternalize) {
      return;
    }
    ValidationInfo::shouldBeTrue<wasm::RefAs*>
              (this->info,
               (bool)((byte)((((this->
                               super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                               ).
                               super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                               .
                               super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                              .currModule)->features).features >> 10) & 1),curr,
               "extern.internalize requries GC [--enable-gc]",
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
               ).
               super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .currFunction);
    if ((curr->super_SpecificExpression<(wasm::Expression::Id)72>).super_Expression.type.id == 1) {
      return;
    }
    left.id = (curr->value->type).id;
    wasm::Type::Type(&local_38,(HeapType)0x0,Nullable);
    curr_00 = curr->value;
    text = "extern.internalize value should be an externref";
  }
  shouldBeSubType(this,left,local_38,curr_00,text);
  return;
}

Assistant:

void FunctionValidator::visitRefAs(RefAs* curr) {
  switch (curr->op) {
    default:
      // TODO: validate all the other ref.as_*
      break;
    case ExternInternalize: {
      shouldBeTrue(getModule()->features.hasGC(),
                   curr,
                   "extern.internalize requries GC [--enable-gc]");
      if (curr->type == Type::unreachable) {
        return;
      }
      shouldBeSubType(curr->value->type,
                      Type(HeapType::ext, Nullable),
                      curr->value,
                      "extern.internalize value should be an externref");
      break;
    }
    case ExternExternalize: {
      shouldBeTrue(getModule()->features.hasGC(),
                   curr,
                   "extern.externalize requries GC [--enable-gc]");
      if (curr->type == Type::unreachable) {
        return;
      }
      shouldBeSubType(curr->value->type,
                      Type(HeapType::any, Nullable),
                      curr->value,
                      "extern.externalize value should be an anyref");
      break;
    }
  }
}